

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Situations * __thiscall
parser::Parser::goTo
          (Situations *__return_storage_ptr__,Parser *this,Grammar *grammar,Situations *situations,
          GrammaticSymbol *grammaticSymbol)

{
  const_reference pvVar1;
  pointer pSVar2;
  _Iter _Var3;
  iterator goToSit;
  insert_iterator<std::vector<parser::Situation,_std::allocator<parser::Situation>_>_> __result;
  Situations goToSituations;
  vector<parser::Situation,_std::allocator<parser::Situation>_> local_48;
  
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_start = (Situation *)0x0;
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_finish = (Situation *)0x0;
  local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var3._M_current = (Situation *)grammaticSymbol;
  for (pSVar2 = (situations->
                super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 != (situations->
                super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
                super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    if ((long)(pSVar2->super_Convolution).body.
              super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pSVar2->super_Convolution).body.
              super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 != pSVar2->point) {
      pvVar1 = std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>::at
                         (&(pSVar2->super_Convolution).body,pSVar2->point);
      if ((pvVar1->value == grammaticSymbol->value) &&
         (pvVar1->isTerminal == grammaticSymbol->isTerminal)) {
        std::vector<parser::Situation,_std::allocator<parser::Situation>_>::push_back
                  (&local_48,pSVar2);
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar2 = local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    for (; pSVar2 != local_48.
                     super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
                     _M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
      pSVar2->point = pSVar2->point + 1;
      closure(__return_storage_ptr__,grammar,pSVar2);
    }
    __result.iter._M_current = _Var3._M_current;
    __result.container =
         (vector<parser::Situation,_std::allocator<parser::Situation>_> *)
         (__return_storage_ptr__->
         super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>)._M_impl.
         super__Vector_impl_data._M_start;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<parser::Situation*,std::insert_iterator<std::vector<parser::Situation,std::allocator<parser::Situation>>>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_48.super__Vector_base<parser::Situation,_std::allocator<parser::Situation>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Situation *)__return_storage_ptr__,
               __result);
  }
  std::vector<parser::Situation,_std::allocator<parser::Situation>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Situations goTo(Grammar const& grammar,
                        Situations const& situations,
                        GrammaticSymbol const& grammaticSymbol) {
            Situations goToSituations;
            for_each_c(Situations, situations, s) {
                if (s->body.size() == s->point)
                    continue;
                if (s->body.at(s->point) == grammaticSymbol) {
                    goToSituations.push_back(*s);
                }
            }
            if (goToSituations.empty()) {
                return Situations();
            }
            Situations goToClosure;
            for_each(Situations, goToSituations, goToSit) {
                goToSit->point++;
                closure(goToClosure, grammar, *goToSit);
            }
            std::copy(goToSituations.begin(), goToSituations.end(), std::inserter(goToClosure, goToClosure.begin()));
            return goToClosure;
        }